

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::
emplaceRealloc<slang::ast::CaseAssertionExpr::ItemGroup>
          (SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> *this,pointer pos,
          ItemGroup *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_type sVar3;
  undefined8 *puVar4;
  size_type sVar5;
  undefined8 uVar6;
  pointer pIVar7;
  pointer pIVar8;
  pointer pIVar9;
  long lVar10;
  ulong capacity;
  long lVar11;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pIVar8 = (pointer)detail::allocArray(capacity,0x18);
  *(AssertionExpr **)((long)pIVar8 + lVar11 + 0x10) = (args->body).ptr;
  sVar3 = (args->expressions).size_;
  *(undefined8 *)((long)pIVar8 + lVar11) = (args->expressions).data_;
  ((undefined8 *)((long)pIVar8 + lVar11))[1] = sVar3;
  pIVar9 = this->data_;
  sVar3 = this->len;
  pIVar7 = pIVar8;
  if (pIVar9 + sVar3 == pos) {
    if (sVar3 != 0) {
      lVar10 = 0;
      do {
        *(undefined8 *)((long)&(pIVar8->body).ptr + lVar10) =
             *(undefined8 *)((long)&(pIVar9->body).ptr + lVar10);
        puVar4 = (undefined8 *)((long)&(pIVar9->expressions).data_ + lVar10);
        uVar6 = puVar4[1];
        puVar1 = (undefined8 *)((long)&(pIVar8->expressions).data_ + lVar10);
        *puVar1 = *puVar4;
        puVar1[1] = uVar6;
        lVar10 = lVar10 + 0x18;
      } while (sVar3 * 0x18 != lVar10);
    }
  }
  else {
    for (; pIVar9 != pos; pIVar9 = pIVar9 + 1) {
      (pIVar7->body).ptr = (pIVar9->body).ptr;
      sVar3 = (pIVar9->expressions).size_;
      (pIVar7->expressions).data_ = (pIVar9->expressions).data_;
      (pIVar7->expressions).size_ = sVar3;
      pIVar7 = pIVar7 + 1;
    }
    sVar3 = this->len;
    pIVar9 = this->data_;
    if (pIVar9 + sVar3 != pos) {
      puVar4 = (undefined8 *)(lVar11 + (long)pIVar8);
      do {
        puVar4[5] = (pos->body).ptr;
        sVar5 = (pos->expressions).size_;
        puVar4[3] = (pos->expressions).data_;
        puVar4[4] = sVar5;
        pos = pos + 1;
        puVar4 = puVar4 + 3;
      } while (pos != pIVar9 + sVar3);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pIVar8;
  return (pointer)((long)pIVar8 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}